

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

EmptyStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EmptyStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2)

{
  Token semicolon;
  EmptyStatementSyntax *this_00;
  
  this_00 = (EmptyStatementSyntax *)allocate(this,0x68,8);
  semicolon.kind = args_2->kind;
  semicolon._2_1_ = args_2->field_0x2;
  semicolon.numFlags.raw = (args_2->numFlags).raw;
  semicolon.rawLen = args_2->rawLen;
  semicolon.info = args_2->info;
  slang::syntax::EmptyStatementSyntax::EmptyStatementSyntax(this_00,*args,args_1,semicolon);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }